

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListModeViewBase::updateHorizontalScrollBar(QListModeViewBase *this,QSize *step)

{
  Flow FVar1;
  QListViewPrivate *pQVar2;
  QWidgetData *pQVar3;
  ScrollMode SVar4;
  int step_00;
  QScrollBar *pQVar5;
  QList<int> *pQVar6;
  int iVar7;
  
  SVar4 = QAbstractItemView::horizontalScrollMode
                    ((QAbstractItemView *)(this->super_QCommonListViewBase).qq);
  if (SVar4 == ScrollPerItem) {
    pQVar2 = (this->super_QCommonListViewBase).dd;
    FVar1 = pQVar2->flow;
    if (((FVar1 == TopToBottom) && (pQVar2->wrap != false)) ||
       ((FVar1 == LeftToRight && (pQVar2->wrap == false)))) {
      pQVar6 = &this->scrollValueMap;
      if (FVar1 == TopToBottom) {
        pQVar6 = &this->segmentPositions;
      }
      iVar7 = (int)(pQVar6->d).size + -1;
      if (iVar7 < 1) {
        pQVar5 = QAbstractScrollArea::horizontalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        iVar7 = 0;
      }
      else {
        pQVar3 = ((pQVar2->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport
                 )->data;
        step_00 = perItemScrollingPageSteps
                            (this,((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1,
                             (this->super_QCommonListViewBase).contentsSize.wd.m_i,pQVar2->wrap);
        pQVar5 = QAbstractScrollArea::horizontalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        QAbstractSlider::setSingleStep(&pQVar5->super_QAbstractSlider,1);
        pQVar5 = QAbstractScrollArea::horizontalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        QAbstractSlider::setPageStep(&pQVar5->super_QAbstractSlider,step_00);
        pQVar5 = QAbstractScrollArea::horizontalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        iVar7 = iVar7 - step_00;
      }
      QAbstractSlider::setRange(&pQVar5->super_QAbstractSlider,0,iVar7);
      return;
    }
  }
  QCommonListViewBase::updateHorizontalScrollBar(&this->super_QCommonListViewBase,step);
  return;
}

Assistant:

void QListModeViewBase::updateHorizontalScrollBar(const QSize &step)
{
    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem
        && ((flow() == QListView::TopToBottom && isWrapping())
        || (flow() == QListView::LeftToRight && !isWrapping()))) {
            int steps = (flow() == QListView::TopToBottom ? segmentPositions : scrollValueMap).size() - 1;
            if (steps > 0) {
                const int pageSteps = perItemScrollingPageSteps(viewport()->width(), contentsSize.width(), isWrapping());
                horizontalScrollBar()->setSingleStep(1);
                horizontalScrollBar()->setPageStep(pageSteps);
                horizontalScrollBar()->setRange(0, steps - pageSteps);
            } else {
                horizontalScrollBar()->setRange(0, 0);
            }
    } else {
        QCommonListViewBase::updateHorizontalScrollBar(step);
    }
}